

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_process.cc
# Opt level: O2

void flyd::flyd_master_process_cycle(void)

{
  int iVar1;
  __pid_t _Var2;
  self *psVar3;
  LogStream *this;
  bool bVar4;
  SourceFile file;
  SourceFile file_00;
  SourceFile file_01;
  SourceFile file_02;
  SourceFile file_03;
  SourceFile file_04;
  undefined1 local_1148 [12];
  undefined1 local_1138 [12];
  undefined1 local_1128 [12];
  undefined1 local_1118 [12];
  sigset_t set_1;
  sigset_t set;
  Logger local_1008;
  
  sigemptyset((sigset_t *)&set);
  sigaddset((sigset_t *)&set,0x11);
  sigaddset((sigset_t *)&set,0xe);
  sigaddset((sigset_t *)&set,0x1d);
  sigaddset((sigset_t *)&set,2);
  sigaddset((sigset_t *)&set,1);
  sigaddset((sigset_t *)&set,10);
  sigaddset((sigset_t *)&set,0xc);
  sigaddset((sigset_t *)&set,0x1c);
  sigaddset((sigset_t *)&set,0xf);
  sigaddset((sigset_t *)&set,3);
  iVar1 = sigprocmask(0,(sigset_t *)&set,(sigset_t *)0x0);
  if (iVar1 == -1) {
    muduo::Logger::SourceFile::SourceFile<102>
              ((SourceFile *)local_1138,
               (char (*) [102])
               "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/proc/flyd_process.cc"
              );
    file._12_4_ = 0;
    file.data_ = (char *)local_1138._0_8_;
    file.size_ = local_1138._8_4_;
    muduo::Logger::Logger(&local_1008,file,0x75,ERROR);
    muduo::LogStream::operator<<(&local_1008.impl_.stream_,anon_var_dwarf_167b5);
    muduo::Logger::~Logger(&local_1008);
  }
  iVar1 = 4;
  do {
    while( true ) {
      bVar4 = iVar1 == 0;
      iVar1 = iVar1 + -1;
      if (bVar4) {
        sigemptyset((sigset_t *)&set);
        iVar1 = sigprocmask(2,(sigset_t *)&set,(sigset_t *)0x0);
        if (iVar1 == -1) {
          muduo::Logger::SourceFile::SourceFile<102>
                    ((SourceFile *)local_1148,
                     (char (*) [102])
                     "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/proc/flyd_process.cc"
                    );
          file_01._12_4_ = 0;
          file_01.data_ = (char *)local_1148._0_8_;
          file_01.size_ = local_1148._8_4_;
          muduo::Logger::Logger(&local_1008,file_01,0x82,ERROR);
          muduo::LogStream::operator<<(&local_1008.impl_.stream_,anon_var_dwarf_167cb);
          muduo::Logger::~Logger(&local_1008);
        }
        dummyFlush();
        do {
          sleep(1);
        } while( true );
      }
      _Var2 = fork();
      if (_Var2 != -1) break;
      muduo::Logger::SourceFile::SourceFile<102>
                ((SourceFile *)&set_1,
                 (char (*) [102])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/proc/flyd_process.cc"
                );
      file_00._12_4_ = 0;
      file_00._0_12_ = set_1.__val._0_12_;
      muduo::Logger::Logger(&local_1008,file_00,0xa7,FATAL);
      muduo::LogStream::operator<<(&local_1008.impl_.stream_,anon_var_dwarf_167f5);
      muduo::Logger::~Logger(&local_1008);
    }
  } while (_Var2 != 0);
  flyd_parent = getppid();
  flyd_pid = getpid();
  flyd_process = FLYD_WORK_PROCESS;
  prctl(0xf,"flyd_worker");
  sigemptyset((sigset_t *)&set_1);
  iVar1 = sigprocmask(2,(sigset_t *)&set_1,(sigset_t *)0x0);
  if (iVar1 == -1) {
    muduo::Logger::SourceFile::SourceFile<102>
              ((SourceFile *)local_1118,
               (char (*) [102])
               "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/proc/flyd_process.cc"
              );
    file_02._12_4_ = 0;
    file_02.data_ = (char *)local_1118._0_8_;
    file_02.size_ = local_1118._8_4_;
    muduo::Logger::Logger(&local_1008,file_02,0xdb,ERROR);
    muduo::LogStream::operator<<(&local_1008.impl_.stream_,anon_var_dwarf_16837);
    muduo::Logger::~Logger(&local_1008);
  }
  muduo::ThreadPool::start(&g_threadpool,5);
  bVar4 = CSocekt::Initialize_subproc(&g_socket.super_CSocekt);
  if (!bVar4) {
    muduo::Logger::SourceFile::SourceFile<102>
              ((SourceFile *)local_1128,
               (char (*) [102])
               "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/proc/flyd_process.cc"
              );
    file_03._12_4_ = 0;
    file_03.data_ = (char *)local_1128._0_8_;
    file_03.size_ = local_1128._8_4_;
    muduo::Logger::Logger(&local_1008,file_03,0xe3,FATAL);
    muduo::LogStream::operator<<(&local_1008.impl_.stream_,anon_var_dwarf_1684d);
    muduo::Logger::~Logger(&local_1008);
  }
  CSocekt::flyd_epoll_init(&g_socket.super_CSocekt);
  if (muduo::g_logLevel < 3) {
    muduo::Logger::SourceFile::SourceFile<102>
              ((SourceFile *)&set_1,
               (char (*) [102])
               "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/proc/flyd_process.cc"
              );
    file_04._12_4_ = 0;
    file_04._0_12_ = set_1.__val._0_12_;
    muduo::Logger::Logger(&local_1008,file_04,0xc5);
    psVar3 = muduo::LogStream::operator<<(&local_1008.impl_.stream_,anon_var_dwarf_1680b);
    psVar3 = muduo::LogStream::operator<<(psVar3,"flyd_worker");
    this = muduo::LogStream::operator<<(psVar3,flyd_pid);
    muduo::LogStream::operator<<(this,anon_var_dwarf_16821);
    muduo::Logger::~Logger(&local_1008);
  }
  dummyFlush();
  do {
    flyd_process_events_and_timers();
  } while( true );
}

Assistant:

void flyd_master_process_cycle() {
        sigset_t set;        //信号集

        sigemptyset(&set);   //清空信号集

        //下列这些信号在执行本函数期间不希望收到【考虑到官方nginx中有这些信号，老师就都搬过来了】（保护不希望由信号中断的代码临界区）
        //建议fork()子进程时学习这种写法，防止信号的干扰；
        sigaddset(&set, SIGCHLD);     //子进程状态改变
        sigaddset(&set, SIGALRM);     //定时器超时
        sigaddset(&set, SIGIO);       //异步I/O
        sigaddset(&set, SIGINT);      //终端中断符
        sigaddset(&set, SIGHUP);      //连接断开
        sigaddset(&set, SIGUSR1);     //用户定义信号
        sigaddset(&set, SIGUSR2);     //用户定义信号
        sigaddset(&set, SIGWINCH);    //终端窗口大小改变
        sigaddset(&set, SIGTERM);     //终止
        sigaddset(&set, SIGQUIT);     //终端退出符
        //.........可以根据开发的实际需要往其中添加其他要屏蔽的信号......

        //设置，此时无法接受的信号；阻塞期间，你发过来的上述信号，多个会被合并为一个，暂存着，等你放开信号屏蔽后才能收到这些信号。。。
        //sigprocmask()在第三章第五节详细讲解过 ， 设置信号屏蔽
        if (sigprocmask(SIG_BLOCK, &set, NULL) == -1) //第一个参数用了SIG_BLOCK表明设置 进程 新的信号屏蔽字 为 “当前信号屏蔽字 和 第二个参数指向的信号集的并集
        {
            LOG_ERROR << "信号屏蔽设置失败!";
        }
        //即便sigprocmask失败，程序流程 也继续往下走

        //从配置文件中读取要创建的worker进程数量
//    CConfig *p_config = CConfig::GetInstance(); //单例类
//    int workprocess = p_config->GetIntDefault("WorkerProcesses",1); //从配置文件中得到要创建的worker进程数量
        flyd_start_worker_processes(4);  //这里要创建worker子进程

        //清空信号屏蔽
        sigemptyset(&set); //信号屏蔽字为空，表示不屏蔽任何信号
        if (sigprocmask(SIG_SETMASK, &set, NULL) == -1) //第一个参数用了SIG_BLOCK表明设置 进程 新的信号屏蔽字 为 “当前信号屏蔽字 和 第二个参数指向的信号集的并集
        {
            LOG_ERROR << "清空信号屏蔽失败!";
        }

        dummyFlush();//进入主循环前将日志消息写入文件
        while(1) {

            //    usleep(100000);
            //ngx_log_error_core(0,0,"haha--这是父进程，pid为%P",ngx_pid);

           // sigsuspend(&set); //阻塞在这里，等待一个信号，此时进程是挂起的，不占用cpu时间，只有收到信号才会被唤醒（返回）；

            sleep(1); //休息1秒
            //以后扩充.......

        }// end for(;;)

    }